

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_io.cpp
# Opt level: O2

uint32_t findTaggedAliasListsOffset(char *alias,char *standard,UErrorCode *pErrorCode)

{
  ushort uVar1;
  uint16_t *puVar2;
  uint16_t *puVar3;
  uint32_t uVar4;
  UBool UVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  int iVar8;
  ulong uVar9;
  uint32_t uVar10;
  ulong uVar11;
  UErrorCode myErr;
  
  myErr = U_ZERO_ERROR;
  uVar6 = getTagNumber(standard);
  uVar7 = findConverter(alias,(UBool *)0x0,&myErr);
  if (myErr != U_ZERO_ERROR) {
    *pErrorCode = myErr;
  }
  uVar4 = gMainTable.converterListSize;
  puVar3 = gMainTable.taggedAliasLists;
  puVar2 = gMainTable.taggedAliasArray;
  uVar10 = 0xffffffff;
  if ((uVar6 < gMainTable.tagListSize - 1) && (uVar7 < gMainTable.converterListSize)) {
    iVar8 = uVar6 * gMainTable.converterListSize;
    uVar1 = gMainTable.taggedAliasArray[uVar7 + iVar8];
    uVar10 = (uint32_t)uVar1;
    if (((uVar1 == 0) || (gMainTable.taggedAliasLists[(ulong)uVar1 + 1] == 0)) &&
       (uVar10 = 0, myErr == U_AMBIGUOUS_ALIAS_WARNING)) {
      uVar9 = (ulong)gMainTable.taggedAliasArraySize;
      uVar10 = 0;
      for (uVar11 = 0; uVar9 != uVar11; uVar11 = uVar11 + 1) {
        uVar1 = puVar2[uVar11];
        if ((uVar1 != 0) && (UVar5 = isAliasInList(alias,(uint)uVar1), UVar5 != '\0')) {
          uVar1 = puVar2[(uint)((int)((uVar11 & 0xffffffff) % (ulong)uVar4) + iVar8)];
          if (((ulong)uVar1 != 0) && (puVar3[(ulong)uVar1 + 1] != 0)) {
            return (uint)uVar1;
          }
        }
      }
    }
  }
  return uVar10;
}

Assistant:

static uint32_t
findTaggedAliasListsOffset(const char *alias, const char *standard, UErrorCode *pErrorCode) {
    uint32_t idx;
    uint32_t listOffset;
    uint32_t convNum;
    UErrorCode myErr = U_ZERO_ERROR;
    uint32_t tagNum = getTagNumber(standard);

    /* Make a quick guess. Hopefully they used a TR22 canonical alias. */
    convNum = findConverter(alias, NULL, &myErr);
    if (myErr != U_ZERO_ERROR) {
        *pErrorCode = myErr;
    }

    if (tagNum < (gMainTable.tagListSize - UCNV_NUM_HIDDEN_TAGS) && convNum < gMainTable.converterListSize) {
        listOffset = gMainTable.taggedAliasArray[tagNum*gMainTable.converterListSize + convNum];
        if (listOffset && gMainTable.taggedAliasLists[listOffset + 1]) {
            return listOffset;
        }
        if (myErr == U_AMBIGUOUS_ALIAS_WARNING) {
            /* Uh Oh! They used an ambiguous alias.
               We have to search the whole swiss cheese starting
               at the highest standard affinity.
               This may take a while.
            */
            for (idx = 0; idx < gMainTable.taggedAliasArraySize; idx++) {
                listOffset = gMainTable.taggedAliasArray[idx];
                if (listOffset && isAliasInList(alias, listOffset)) {
                    uint32_t currTagNum = idx/gMainTable.converterListSize;
                    uint32_t currConvNum = (idx - currTagNum*gMainTable.converterListSize);
                    uint32_t tempListOffset = gMainTable.taggedAliasArray[tagNum*gMainTable.converterListSize + currConvNum];
                    if (tempListOffset && gMainTable.taggedAliasLists[tempListOffset + 1]) {
                        return tempListOffset;
                    }
                    /* else keep on looking */
                    /* We could speed this up by starting on the next row
                       because an alias is unique per row, right now.
                       This would change if alias versioning appears. */
                }
            }
            /* The standard doesn't know about the alias */
        }
        /* else no default name */
        return 0;
    }
    /* else converter or tag not found */

    return UINT32_MAX;
}